

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  xmlDocPtr doc;
  _xmlDoc *p_Var1;
  _xmlNode *p_Var2;
  xmlValidCtxtPtr pxVar3;
  xmlValidState *pxVar4;
  int iVar5;
  xmlHashTablePtr pxVar6;
  xmlAttributePtr attr;
  xmlChar *pxVar7;
  void *pvVar8;
  xmlValidityWarningFunc p_Var9;
  xmlAutomataPtr pxVar10;
  xmlValidState *pxVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  _xmlDict *dict;
  char *pcVar12;
  undefined4 in_register_0000008c;
  xmlValidState *pxVar13;
  xmlValidCtxtPtr local_60;
  xmlChar *local_58;
  xmlValidCtxtPtr local_50;
  xmlChar *local_48;
  undefined8 local_40;
  xmlHashTablePtr local_38;
  
  if (((dtd == (xmlDtdPtr)0x0) || (name == (xmlChar *)0x0)) || (elem == (xmlChar *)0x0))
  goto LAB_001949c6;
  doc = dtd->doc;
  if (doc == (xmlDocPtr)0x0) {
    local_60 = (xmlValidCtxtPtr)0x0;
  }
  else {
    local_60 = (xmlValidCtxtPtr)doc->dict;
  }
  if (9 < type - XML_ATTRIBUTE_CDATA) {
    xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"Internal: ATTRIBUTE struct corrupted invalid type\n",
                (char *)0x0);
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  local_40 = CONCAT44(in_register_0000008c,type);
  if (defaultValue == (xmlChar *)0x0) {
LAB_00194885:
    defaultValue = (xmlChar *)0x0;
  }
  else {
    iVar5 = xmlValidateAttributeValueInternal(doc,type,defaultValue);
    if (iVar5 == 0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,
                      "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        ctxt->valid = 0;
      }
      goto LAB_00194885;
    }
  }
  p_Var1 = dtd->doc;
  local_48 = defaultValue;
  if (((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->extSubset == dtd)) &&
     ((p_Var1->intSubset != (_xmlDtd *)0x0 &&
      ((pxVar6 = (xmlHashTablePtr)p_Var1->intSubset->attributes, pxVar6 != (xmlHashTablePtr)0x0 &&
       (pvVar8 = xmlHashLookup3(pxVar6,name,ns,elem), pvVar8 != (void *)0x0)))))) goto LAB_001949c6;
  pxVar6 = (xmlHashTablePtr)dtd->attributes;
  if (pxVar6 == (xmlHashTablePtr)0x0) {
    pxVar6 = xmlHashCreateDict(0,(xmlDictPtr)local_60);
    dtd->attributes = pxVar6;
  }
  if (pxVar6 == (xmlHashTablePtr)0x0) {
    pcVar12 = "xmlAddAttributeDecl: Table creation failed!\n";
  }
  else {
    local_50 = ctxt;
    local_38 = pxVar6;
    attr = (xmlAttributePtr)(*xmlMalloc)(0x78);
    if (attr != (xmlAttributePtr)0x0) {
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->atype = 0;
      attr->def = 0;
      attr->defaultValue = (xmlChar *)0x0;
      attr->tree = (xmlEnumerationPtr)0x0;
      attr->prefix = (xmlChar *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->nexth = (_xmlAttribute *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlDtd *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->elem = (xmlChar *)0x0;
      attr->type = XML_ATTRIBUTE_DECL;
      attr->atype = (xmlAttributeType)local_40;
      attr->doc = dtd->doc;
      if (local_60 == (xmlValidCtxtPtr)0x0) {
        pxVar7 = xmlStrdup(name);
        attr->name = pxVar7;
        pxVar7 = xmlStrdup(ns);
        attr->prefix = pxVar7;
        pxVar7 = xmlStrdup(elem);
      }
      else {
        pxVar7 = xmlDictLookup((xmlDictPtr)local_60,name,-1);
        attr->name = pxVar7;
        pxVar7 = xmlDictLookup((xmlDictPtr)local_60,ns,-1);
        attr->prefix = pxVar7;
        pxVar7 = xmlDictLookup((xmlDictPtr)local_60,elem,-1);
      }
      attr->elem = pxVar7;
      attr->def = def;
      attr->tree = tree;
      if (local_48 != (xmlChar *)0x0) {
        if (local_60 == (xmlValidCtxtPtr)0x0) {
          pxVar7 = xmlStrdup(local_48);
        }
        else {
          pxVar7 = xmlDictLookup((xmlDictPtr)local_60,local_48,-1);
        }
        attr->defaultValue = pxVar7;
      }
      iVar5 = xmlHashAddEntry3(local_38,attr->name,attr->prefix,attr->elem,attr);
      if (iVar5 < 0) {
        xmlErrValidWarning(local_50,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,
                           "Attribute %s of element %s: already defined\n",name,elem,(xmlChar *)0x0)
        ;
        xmlFreeAttribute(attr);
        return (xmlAttributePtr)0x0;
      }
      local_58 = (xmlChar *)0x0;
      if (dtd->elements == (void *)0x0) {
        if (dtd->doc == (_xmlDoc *)0x0) {
          dict = (xmlDictPtr)0x0;
        }
        else {
          dict = dtd->doc->dict;
        }
        pxVar6 = xmlHashCreateDict(0,dict);
        dtd->elements = pxVar6;
        if (pxVar6 != (xmlHashTablePtr)0x0) goto LAB_00194ac8;
        pcVar12 = "element table allocation failed";
LAB_00194bc6:
        local_60 = (xmlValidCtxtPtr)0x0;
        xmlVErrMemory((xmlValidCtxtPtr)0x0,pcVar12);
        iVar5 = extraout_EDX_03;
      }
      else {
LAB_00194ac8:
        pxVar6 = (xmlHashTablePtr)dtd->elements;
        local_48 = xmlSplitQName2(elem,&local_58);
        pxVar7 = local_48;
        if (local_48 == (xmlChar *)0x0) {
          pxVar7 = elem;
        }
        local_60 = (xmlValidCtxtPtr)xmlHashLookup2(pxVar6,pxVar7,local_58);
        iVar5 = extraout_EDX;
        if (local_60 == (xmlValidCtxtPtr)0x0) {
          local_60 = (xmlValidCtxtPtr)(*xmlMalloc)(0x70);
          if (local_60 == (xmlValidCtxtPtr)0x0) {
            pcVar12 = "malloc failed";
            goto LAB_00194bc6;
          }
          local_60->userData = (void *)0x0;
          local_60->error = (xmlValidityErrorFunc)0x0;
          local_60->am = (xmlAutomataPtr)0x0;
          local_60->state = (xmlAutomataStatePtr)0x0;
          local_60->vstateNr = 0;
          local_60->vstateMax = 0;
          local_60->vstateTab = (xmlValidState *)0x0;
          *(undefined8 *)&local_60->valid = 0;
          local_60->vstate = (xmlValidState *)0x0;
          *(undefined8 *)&local_60->finishDtd = 0;
          local_60->doc = (xmlDocPtr)0x0;
          local_60->nodeNr = 0;
          local_60->nodeMax = 0;
          local_60->nodeTab = (xmlNodePtr *)0x0;
          local_60->warning = (xmlValidityWarningFunc)0x0;
          local_60->node = (xmlNodePtr)0x0;
          *(undefined4 *)&local_60->error = 0xf;
          p_Var9 = (xmlValidityWarningFunc)xmlStrdup(pxVar7);
          local_60->warning = p_Var9;
          pxVar10 = (xmlAutomataPtr)xmlStrdup(local_58);
          local_60->am = pxVar10;
          *(undefined4 *)&local_60->vstate = 0;
          xmlHashAddEntry2(pxVar6,pxVar7,local_58,local_60);
          iVar5 = extraout_EDX_00;
        }
        if (local_58 != (xmlChar *)0x0) {
          (*xmlFree)(local_58);
          iVar5 = extraout_EDX_01;
        }
        if (local_48 != (xmlChar *)0x0) {
          (*xmlFree)(local_48);
          iVar5 = extraout_EDX_02;
        }
      }
      if (local_60 != (xmlValidCtxtPtr)0x0) {
        if ((((int)local_40 == 2) &&
            (iVar5 = xmlScanIDAttributeDecl(local_60,(xmlElementPtr)&DAT_00000001,iVar5),
            pxVar3 = local_50, iVar5 != 0)) &&
           (xmlErrValidNode(local_50,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,
                            "Element %s has too may ID attributes defined : %s\n",elem,name,
                            (xmlChar *)0x0), pxVar3 != (xmlValidCtxtPtr)0x0)) {
          local_50->valid = 0;
        }
        iVar5 = xmlStrEqual(attr->name,"xmlns");
        if ((iVar5 == 0) &&
           ((attr->prefix == (xmlChar *)0x0 ||
            (iVar5 = xmlStrEqual(attr->prefix,"xmlns"), iVar5 == 0)))) {
          pxVar13 = (xmlValidState *)&local_60->vstateTab;
          pxVar4 = local_60->vstateTab;
          do {
            pxVar11 = pxVar4;
            if (pxVar11 == (xmlValidState *)0x0) goto LAB_00194c43;
            iVar5 = xmlStrEqual((xmlChar *)pxVar11->exec,"xmlns");
          } while (((iVar5 != 0) ||
                   ((attr->prefix != (xmlChar *)0x0 &&
                    (iVar5 = xmlStrEqual(attr->prefix,"xmlns"), iVar5 != 0)))) &&
                  (pxVar4 = (xmlValidState *)pxVar11[3].elemDecl,
                  (xmlValidState *)pxVar11[3].elemDecl != (xmlValidState *)0x0));
          pxVar13 = pxVar11 + 3;
        }
        else {
          pxVar13 = (xmlValidState *)&local_60->vstateTab;
        }
LAB_00194c43:
        attr->nexth = (_xmlAttribute *)pxVar13->elemDecl;
        pxVar13->elemDecl = (xmlElementPtr)attr;
      }
      attr->parent = dtd;
      p_Var2 = dtd->last;
      if (p_Var2 == (_xmlNode *)0x0) {
        dtd->last = (_xmlNode *)attr;
        dtd->children = (_xmlNode *)attr;
        return attr;
      }
      p_Var2->next = (_xmlNode *)attr;
      attr->prev = p_Var2;
      dtd->last = (_xmlNode *)attr;
      return attr;
    }
    pcVar12 = "malloc failed";
    ctxt = local_50;
  }
  xmlVErrMemory(ctxt,pcVar12);
LAB_001949c6:
  xmlFreeEnumeration(tree);
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid type\n",
		    NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddAttributeDecl: Table creation failed!\n");
	xmlFreeEnumeration(tree);
        return(NULL);
    }


    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->prefix = xmlDictLookup(dict, ns, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->prefix = xmlStrdup(ns);
	ret->elem = xmlStrdup(elem);
    }
    ret->def = def;
    ret->tree = tree;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
    }

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    if (xmlHashAddEntry3(table, ret->name, ret->prefix, ret->elem, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The attribute is already defined in this DTD.
	 */
	xmlErrValidWarning(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_REDEFINED,
		 "Attribute %s of element %s: already defined\n",
		 name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
    elemDef = xmlGetDtdElementDesc2(dtd, elem, 1);
    if (elemDef != NULL) {

#ifdef LIBXML_VALID_ENABLED
        if ((type == XML_ATTRIBUTE_ID) &&
	    (xmlScanIDAttributeDecl(NULL, elemDef, 1) != 0)) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
	   "Element %s has too may ID attributes defined : %s\n",
		   elem, name, NULL);
	    if (ctxt != NULL)
		ctxt->valid = 0;
	}
#endif /* LIBXML_VALID_ENABLED */

	/*
	 * Insert namespace default def first they need to be
	 * processed first.
	 */
	if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
	    ((ret->prefix != NULL &&
	     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
	    ret->nexth = elemDef->attributes;
	    elemDef->attributes = ret;
	} else {
	    xmlAttributePtr tmp = elemDef->attributes;

	    while ((tmp != NULL) &&
		   ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
		    ((ret->prefix != NULL &&
		     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
		if (tmp->nexth == NULL)
		    break;
		tmp = tmp->nexth;
	    }
	    if (tmp != NULL) {
		ret->nexth = tmp->nexth;
	        tmp->nexth = ret;
	    } else {
		ret->nexth = elemDef->attributes;
		elemDef->attributes = ret;
	    }
	}
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);
}